

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::write_bigint_value
          (basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this,string_view_type *sv)

{
  bignum_format_kind bVar1;
  bool bVar2;
  type_conflict2 tVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  size_type sVar5;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  basic_bigint<std::allocator<unsigned_char>_> *in_RDI;
  size_t length_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v_1;
  int signum_1;
  bool is_neg_1;
  bigint n_1;
  size_t length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  int signum;
  bool is_neg;
  bigint n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe08;
  value_type vVar6;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffe10;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe18;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  value_type *in_stack_fffffffffffffe28;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe30;
  int64_t in_stack_fffffffffffffe38;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffe40;
  int64_t in_stack_fffffffffffffe60;
  uchar local_170 [119];
  byte local_f9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  
  bVar1 = basic_json_encode_options<char>::bignum_format
                    ((basic_json_encode_options<char> *)((long)&in_RDI->field_0 + 8));
  if (bVar1 == number) {
    std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    append(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
           (size_t)in_stack_fffffffffffffe20._M_current);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
    in_RDI[9].field_0.common_stor_.length_ = sVar5 + in_RDI[9].field_0.common_stor_.length_;
  }
  else if (bVar1 == base64) {
    std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    bVar2 = jsoncons::operator<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    if (bVar2) {
      basic_bigint<std::allocator<unsigned_char>_>::operator-
                ((basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe18._M_current);
      jsoncons::operator-(in_RDI,in_stack_fffffffffffffe60);
      basic_bigint<std::allocator<unsigned_char>_>::operator=
                ((basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe20._M_current,
                 (basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe18._M_current);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe10);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe10);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x319571);
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe10,(value_type)((ulong)in_stack_fffffffffffffe08 >> 0x38));
    if (bVar2) {
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffe10,
                  (value_type)((ulong)in_stack_fffffffffffffe08 >> 0x38));
      in_RDI[9].field_0.common_stor_.length_ = in_RDI[9].field_0.common_stor_.length_ + 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffe08);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffe08);
    vVar6 = (value_type)((ulong)in_stack_fffffffffffffe08 >> 0x38);
    tVar3 = encode_base64<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::string_sink<std::__cxx11::string>>
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       (string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffe10);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe10,vVar6);
    in_RDI[9].field_0.common_stor_.length_ = tVar3 + 2 + in_RDI[9].field_0.common_stor_.length_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe20._M_current);
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe10);
  }
  else if (bVar1 == base64url) {
    std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    local_f9 = jsoncons::operator<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    if ((bool)local_f9) {
      basic_bigint<std::allocator<unsigned_char>_>::operator-
                ((basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe18._M_current);
      jsoncons::operator-(in_RDI,in_stack_fffffffffffffe60);
      basic_bigint<std::allocator<unsigned_char>_>::operator=
                ((basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe20._M_current,
                 (basic_bigint<std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe18._M_current);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe10);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe10);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3197f9);
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe10,(value_type)((ulong)in_stack_fffffffffffffe08 >> 0x38));
    if ((local_f9 & 1) != 0) {
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffe10,
                  (value_type)((ulong)in_stack_fffffffffffffe08 >> 0x38));
      in_RDI[9].field_0.common_stor_.length_ = in_RDI[9].field_0.common_stor_.length_ + 1;
    }
    last._M_current = local_170;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffe08);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffe08);
    vVar6 = (value_type)((ulong)in_stack_fffffffffffffe08 >> 0x38);
    pvVar4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             encode_base64url<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::string_sink<std::__cxx11::string>>
                       (in_stack_fffffffffffffe20,last,
                        (string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffe10);
    this_01 = pvVar4;
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe10,vVar6);
    in_RDI[9].field_0.common_stor_.length_ =
         (long)&(pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start + in_RDI[9].field_0.common_stor_.length_ + 2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_01);
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe10);
  }
  else {
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe10,(value_type)((ulong)in_stack_fffffffffffffe08 >> 0x38));
    vVar6 = (value_type)((ulong)&in_RDI->field_0 >> 0x38);
    this_00 = (string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    append(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
           (size_t)in_stack_fffffffffffffe20._M_current);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(this_00,vVar6);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
    in_RDI[9].field_0.common_stor_.length_ = sVar5 + 2 + in_RDI[9].field_0.common_stor_.length_;
  }
  return;
}

Assistant:

void write_bigint_value(const string_view_type& sv)
        {
            switch (options_.bignum_format())
            {
                case bignum_format_kind::raw:
                {
                    sink_.append(sv.data(),sv.size());
                    column_ += sv.size();
                    break;
                }
                case bignum_format_kind::base64:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                        ++column_;
                    }
                    std::size_t length = encode_base64(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    column_ += (length+2);
                    break;
                }
                case bignum_format_kind::base64url:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                        ++column_;
                    }
                    std::size_t length = encode_base64url(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    column_ += (length+2);
                    break;
                }
                default:
                {
                    sink_.push_back('\"');
                    sink_.append(sv.data(),sv.size());
                    sink_.push_back('\"');
                    column_ += (sv.size() + 2);
                    break;
                }
            }
        }